

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptNativeFloatArray *
Js::JavascriptArray::DeepCopyInstance<Js::JavascriptNativeFloatArray>
          (JavascriptNativeFloatArray *instance)

{
  bool bVar1;
  DynamicTypeHandler *this;
  SparseArraySegmentBase **ppSVar2;
  SparseArraySegmentBase *pSVar3;
  Recycler *pRVar4;
  JavascriptNativeFloatArray *this_00;
  TrackAllocData local_40;
  size_t local_18;
  size_t allocSize;
  JavascriptNativeFloatArray *instance_local;
  
  allocSize = (size_t)instance;
  this = DynamicObject::GetTypeHandler((DynamicObject *)instance);
  local_18 = DynamicTypeHandler::GetInlineSlotsSize(this);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)(allocSize + 0x28));
  bVar1 = IsInlineSegment(*ppSVar2,(JavascriptArray *)allocSize);
  if (bVar1) {
    pSVar3 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                       ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)(allocSize + 0x28));
    local_18 = (ulong)pSVar3->size * 8 + 0x18 + local_18;
  }
  pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)allocSize);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&JavascriptNativeFloatArray::typeinfo,local_18,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
             ,0x2f4f);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_40);
  this_00 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar4,0x473830,0);
  JavascriptNativeFloatArray::JavascriptNativeFloatArray
            (this_00,(JavascriptNativeFloatArray *)allocSize,true,true);
  return this_00;
}

Assistant:

T * JavascriptArray::DeepCopyInstance(T * instance)
    {
        size_t allocSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (IsInlineSegment(instance->head, instance))
        {
            allocSize += sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement);
        }

        return RecyclerNewPlusZ(instance->GetRecycler(), allocSize, T, instance, true /*boxHead*/, true /*deepCopy*/);
    }